

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O3

int mbedtls_pk_encrypt(mbedtls_pk_context *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen,
                      size_t osize,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  _func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t_ptr_size_t__func_int_void_ptr_uchar_ptr_size_t_ptr_void_ptr
  *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
    return -16000;
  }
  UNRECOVERED_JUMPTABLE = ctx->pk_info->encrypt_func;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t_ptr_size_t__func_int_void_ptr_uchar_ptr_size_t_ptr_void_ptr
       *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(ctx->pk_ctx,input,ilen,output,olen,osize,f_rng,p_rng);
    return iVar1;
  }
  return -0x3f00;
}

Assistant:

int mbedtls_pk_encrypt( mbedtls_pk_context *ctx,
                const unsigned char *input, size_t ilen,
                unsigned char *output, size_t *olen, size_t osize,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    PK_VALIDATE_RET( ctx != NULL );
    PK_VALIDATE_RET( input != NULL || ilen == 0 );
    PK_VALIDATE_RET( output != NULL || osize == 0 );
    PK_VALIDATE_RET( olen != NULL );

    if( ctx->pk_info == NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->encrypt_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->encrypt_func( ctx->pk_ctx, input, ilen,
                output, olen, osize, f_rng, p_rng ) );
}